

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O0

void __thiscall
duckdb::ScanFilter::ScanFilter
          (ScanFilter *this,ClientContext *context,idx_t index,
          vector<duckdb::StorageIndex,_true> *column_ids,TableFilter *filter)

{
  const_reference this_00;
  pointer pSVar1;
  pointer in_RDX;
  vector<duckdb::StorageIndex,_true> *in_RDI;
  pointer in_R8;
  TableFilter *in_stack_000000e0;
  ClientContext *in_stack_000000e8;
  unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
  *in_stack_ffffffffffffffa8;
  
  (in_RDI->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = in_RDX;
  this_00 = vector<duckdb::StorageIndex,_true>::operator[]
                      (in_RDI,(size_type)in_stack_ffffffffffffffa8);
  pSVar1 = (pointer)StorageIndex::GetPrimaryIndex(this_00);
  (in_RDI->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar1;
  (in_RDI->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_R8;
  *(undefined1 *)
   &in_RDI[1].super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>::
  unique_ptr((unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
              *)0xbb664a);
  TableFilterState::Initialize(in_stack_000000e8,in_stack_000000e0);
  unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>::
  operator=((unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
             *)in_RDI,in_stack_ffffffffffffffa8);
  unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>::
  ~unique_ptr((unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
               *)0xbb667d);
  return;
}

Assistant:

ScanFilter::ScanFilter(ClientContext &context, idx_t index, const vector<StorageIndex> &column_ids, TableFilter &filter)
    : scan_column_index(index), table_column_index(column_ids[index].GetPrimaryIndex()), filter(filter),
      always_true(false) {
	filter_state = TableFilterState::Initialize(context, filter);
}